

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::prepareChildren(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                  *this,Node *n,bool backtrackable)

{
  long *plVar1;
  uint uVar2;
  BacktrackData *pBVar3;
  int iVar4;
  uint *puVar5;
  VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
  *pVVar6;
  BacktrackObject *pBVar7;
  OptionBase<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*>_> local_48;
  IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
  *local_30;
  Value local_28;
  
  iVar4 = (*n->_vptr_Node[2])(n);
  if ((char)iVar4 == '\0') {
    uVar2 = *(uint *)&n[1]._vptr_Node;
    puVar5 = (this->_svStack)._cursor;
    if (puVar5 == (this->_svStack)._end) {
      Lib::Stack<unsigned_int>::expand(&this->_svStack);
      puVar5 = (this->_svStack)._cursor;
    }
    *puVar5 = uVar2;
    (this->_svStack)._cursor = puVar5 + 1;
    local_48._isSome = false;
    local_48._1_7_ = 0;
    local_48._elem._elem = (Value)0x0;
    Lib::OptionBase<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*>_>::operator=
              (&(this->_leafData).
                super_OptionBase<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*>_>
               ,&local_48);
    if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
      plVar1 = (long *)((long)local_48._elem._elem + 8);
      *(int *)plVar1 = *(int *)plVar1 + -1;
      if (*(int *)plVar1 == 0) {
        (**(code **)(*(long *)local_48._elem._elem + 8))();
      }
    }
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>
    ::_selectPotentiallyUnifiableChildren<Indexing::TermWithValue<Kernel::TermList>>
              ((UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>
                *)&local_30,(IntermediateNode *)n,(AbstractingUnifier *)this,2);
    pVVar6 = (this->_nodeIterators)._cursor;
    if (pVVar6 == (this->_nodeIterators)._end) {
      Lib::
      Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>_>
      ::expand(&this->_nodeIterators);
      pVVar6 = (this->_nodeIterators)._cursor;
    }
    pVVar6->_core = local_30;
    if (local_30 ==
        (IteratorCore<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::Node_**>
         *)0x0) {
      (this->_nodeIterators)._cursor = pVVar6 + 1;
    }
    else {
      iVar4 = local_30->_refCnt;
      local_30->_refCnt = iVar4 + 1;
      (this->_nodeIterators)._cursor = pVVar6 + 1;
      local_30->_refCnt = iVar4;
      if (iVar4 == 0) {
        (*local_30->_vptr_IteratorCore[1])();
      }
    }
    if (backtrackable) {
      pBVar3 = (this->_bdStack)._cursor;
      pBVar7 = (BacktrackObject *)
               Lib::FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
      pBVar7->_vptr_BacktrackObject = (_func_int **)&PTR__BacktrackObject_00b336f8;
      pBVar7[1]._vptr_BacktrackObject = (_func_int **)this;
      pBVar7->_next = pBVar3[-1]._boList;
      pBVar3[-1]._boList = pBVar7;
    }
  }
  else {
    (*n->_vptr_Node[8])(&local_28,n);
    local_48._isSome = true;
    if (local_28 == (Value)0x0) {
      local_48._elem._elem = (Value)0x0;
    }
    else {
      local_48._elem._elem = local_28;
      iVar4 = *(int *)((long)local_28 + 8) + 1;
      *(int *)((long)local_28 + 8) = iVar4;
      if (iVar4 == 0) {
        (**(code **)(*(long *)local_28 + 8))();
      }
    }
    Lib::OptionBase<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*>_>::operator=
              (&(this->_leafData).
                super_OptionBase<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*>_>
               ,&local_48);
    if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
      plVar1 = (long *)((long)local_48._elem._elem + 8);
      *(int *)plVar1 = *(int *)plVar1 + -1;
      if (*(int *)plVar1 == 0) {
        (**(code **)(*(long *)local_48._elem._elem + 8))();
      }
    }
    if (local_28 != (Value)0x0) {
      plVar1 = (long *)((long)local_28 + 8);
      *(int *)plVar1 = *(int *)plVar1 + -1;
      if (*(int *)plVar1 == 0) {
        (**(code **)(*(long *)local_28 + 8))();
      }
    }
  }
  return;
}

Assistant:

void prepareChildren(Node* n, bool backtrackable) {
        if(n->isLeaf()) {
          _leafData = some(static_cast<Leaf*>(n)->allChildren());
        } else {
          IntermediateNode* inode=static_cast<IntermediateNode*>(n);
          _svStack.push(inode->childVar);
          _leafData = {};
          DEBUG_QUERY(1, "entering node: S", _svStack.top())
          
          _nodeIterators.push(_algo.template selectPotentiallyUnifiableChildren<LeafData>(inode));
          if (backtrackable) {
            _bdStack.top().addClosure([&]() { 
                DEBUG_CODE(auto var = )_svStack.pop();
                DEBUG_QUERY(1, "backtracking node: S", var)
                _nodeIterators.pop(); 
            });
          }
        }
      }